

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p5_pbev2.cc
# Opt level: O3

int PKCS5_pbe2_decrypt_init
              (pbe_suite *suite,EVP_CIPHER_CTX *ctx,char *pass,size_t pass_len,CBS *param)

{
  uint8_t *puVar1;
  int iVar2;
  uint uVar3;
  EVP_CIPHER *cipher;
  EVP_MD *pbkdf2_md;
  int iVar4;
  CBS iv;
  CBS pbkdf2_params;
  uint64_t iterations;
  CBS enc_scheme;
  CBS kdf;
  CBS pbe_param;
  CBS prf;
  CBS null;
  CBS salt;
  CBS enc_obj;
  CBS kdf_obj;
  CBS local_d0;
  CBS local_c0;
  uint32_t local_b0;
  undefined4 uStack_ac;
  CBS local_a8;
  CBS local_98;
  CBS local_88;
  CBS local_78;
  CBS local_68;
  CBS local_58;
  CBS local_48;
  CBS local_38;
  
  iVar2 = CBS_get_asn1(param,&local_88,0x20000010);
  if (((((iVar2 == 0) || (param->len != 0)) ||
       (iVar2 = CBS_get_asn1(&local_88,&local_98,0x20000010), iVar2 == 0)) ||
      ((iVar2 = CBS_get_asn1(&local_88,&local_a8,0x20000010), iVar2 == 0 || (local_88.len != 0))))
     || ((iVar2 = CBS_get_asn1(&local_98,&local_38,6), iVar2 == 0 ||
         (iVar2 = CBS_get_asn1(&local_a8,&local_48,6), iVar2 == 0)))) {
    iVar2 = 0x68;
    iVar4 = 0xba;
  }
  else {
    iVar2 = CBS_mem_equal(&local_38,kPBKDF2,9);
    if (iVar2 == 0) {
      iVar2 = 0x80;
      iVar4 = 0xc0;
      goto LAB_0050bb6f;
    }
    cipher = (EVP_CIPHER *)cbs_to_cipher(&local_48);
    if (cipher == (EVP_CIPHER *)0x0) {
      iVar2 = 0x7f;
      iVar4 = 199;
      goto LAB_0050bb6f;
    }
    iVar2 = CBS_get_asn1(&local_98,&local_c0,0x20000010);
    if (((iVar2 == 0) || (local_98.len != 0)) ||
       ((iVar2 = CBS_get_asn1(&local_c0,&local_58,4), iVar2 == 0 ||
        (iVar2 = CBS_get_asn1_uint64(&local_c0,(uint64_t *)&local_b0), iVar2 == 0)))) {
      iVar2 = 0x68;
      iVar4 = 0xd2;
      goto LAB_0050bb6f;
    }
    iVar2 = pkcs12_iterations_acceptable(CONCAT44(uStack_ac,local_b0));
    if (iVar2 == 0) {
      iVar2 = 0x81;
      iVar4 = 0xd7;
      goto LAB_0050bb6f;
    }
    iVar2 = CBS_peek_asn1_tag(&local_c0,2);
    if (iVar2 != 0) {
      iVar2 = CBS_get_asn1_uint64(&local_c0,(uint64_t *)&local_d0);
      puVar1 = local_d0.data;
      if (iVar2 == 0) {
        iVar2 = 0x68;
        iVar4 = 0xe0;
        goto LAB_0050be9e;
      }
      uVar3 = EVP_CIPHER_key_length(cipher);
      if (puVar1 != (uint8_t *)(ulong)uVar3) {
        iVar2 = 0x7d;
        iVar4 = 0xe5;
        goto LAB_0050be9e;
      }
    }
    pbkdf2_md = EVP_sha1();
    if (local_c0.len != 0) {
      iVar2 = CBS_get_asn1(&local_c0,&local_d0,0x20000010);
      if (((iVar2 == 0) || (iVar2 = CBS_get_asn1(&local_d0,&local_78,6), iVar2 == 0)) ||
         (local_c0.len != 0)) {
        iVar2 = 0x68;
        iVar4 = 0xf0;
LAB_0050be9e:
        ERR_put_error(0x13,0,iVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                      ,iVar4);
        return 0;
      }
      iVar2 = CBS_mem_equal(&local_78,kHMACWithSHA1,8);
      if (iVar2 == 0) {
        iVar2 = CBS_mem_equal(&local_78,kHMACWithSHA256,8);
        if (iVar2 == 0) {
          iVar2 = 0x82;
          iVar4 = 0xfb;
          goto LAB_0050be9e;
        }
        pbkdf2_md = EVP_sha256();
      }
      else {
        pbkdf2_md = EVP_sha1();
      }
      iVar2 = CBS_get_asn1(&local_d0,&local_68,5);
      if (((iVar2 == 0) || (local_68.len != 0)) || (local_d0.len != 0)) {
        iVar2 = 0x68;
        iVar4 = 0x104;
        goto LAB_0050bb6f;
      }
    }
    iVar2 = CBS_get_asn1(&local_a8,&local_d0,4);
    if ((iVar2 != 0) && (local_a8.len == 0)) {
      iVar2 = pkcs5_pbe2_cipher_init
                        (ctx,(EVP_CIPHER *)cipher,(EVP_MD *)pbkdf2_md,local_b0,pass,pass_len,
                         local_58.data,local_58.len,local_d0.data,local_d0.len,0);
      return iVar2;
    }
    iVar2 = 0x82;
    iVar4 = 0x110;
  }
LAB_0050bb6f:
  ERR_put_error(0x13,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                ,iVar4);
  return 0;
}

Assistant:

int PKCS5_pbe2_decrypt_init(const struct pbe_suite *suite, EVP_CIPHER_CTX *ctx,
                            const char *pass, size_t pass_len, CBS *param) {
  CBS pbe_param, kdf, kdf_obj, enc_scheme, enc_obj;
  if (!CBS_get_asn1(param, &pbe_param, CBS_ASN1_SEQUENCE) ||
      CBS_len(param) != 0 ||
      !CBS_get_asn1(&pbe_param, &kdf, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&pbe_param, &enc_scheme, CBS_ASN1_SEQUENCE) ||
      CBS_len(&pbe_param) != 0 ||
      !CBS_get_asn1(&kdf, &kdf_obj, CBS_ASN1_OBJECT) ||
      !CBS_get_asn1(&enc_scheme, &enc_obj, CBS_ASN1_OBJECT)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    return 0;
  }

  // Only PBKDF2 is supported.
  if (!CBS_mem_equal(&kdf_obj, kPBKDF2, sizeof(kPBKDF2))) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_KEY_DERIVATION_FUNCTION);
    return 0;
  }

  // See if we recognise the encryption algorithm.
  const EVP_CIPHER *cipher = cbs_to_cipher(&enc_obj);
  if (cipher == NULL) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_CIPHER);
    return 0;
  }

  // Parse the KDF parameters. See RFC 8018, appendix A.2.
  CBS pbkdf2_params, salt;
  uint64_t iterations;
  if (!CBS_get_asn1(&kdf, &pbkdf2_params, CBS_ASN1_SEQUENCE) ||
      CBS_len(&kdf) != 0 ||
      !CBS_get_asn1(&pbkdf2_params, &salt, CBS_ASN1_OCTETSTRING) ||
      !CBS_get_asn1_uint64(&pbkdf2_params, &iterations)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    return 0;
  }

  if (!pkcs12_iterations_acceptable(iterations)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_ITERATION_COUNT);
    return 0;
  }

  // The optional keyLength parameter, if present, must match the key length of
  // the cipher.
  if (CBS_peek_asn1_tag(&pbkdf2_params, CBS_ASN1_INTEGER)) {
    uint64_t key_len;
    if (!CBS_get_asn1_uint64(&pbkdf2_params, &key_len)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
      return 0;
    }

    if (key_len != EVP_CIPHER_key_length(cipher)) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_KEYLENGTH);
      return 0;
    }
  }

  const EVP_MD *md = EVP_sha1();
  if (CBS_len(&pbkdf2_params) != 0) {
    CBS alg_id, prf;
    if (!CBS_get_asn1(&pbkdf2_params, &alg_id, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1(&alg_id, &prf, CBS_ASN1_OBJECT) ||
        CBS_len(&pbkdf2_params) != 0) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
      return 0;
    }

    if (CBS_mem_equal(&prf, kHMACWithSHA1, sizeof(kHMACWithSHA1))) {
      // hmacWithSHA1 is the DEFAULT, so DER requires it be omitted, but we
      // match OpenSSL in tolerating it being present.
      md = EVP_sha1();
    } else if (CBS_mem_equal(&prf, kHMACWithSHA256, sizeof(kHMACWithSHA256))) {
      md = EVP_sha256();
    } else {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_PRF);
      return 0;
    }

    // All supported PRFs use a NULL parameter.
    CBS null;
    if (!CBS_get_asn1(&alg_id, &null, CBS_ASN1_NULL) ||
        CBS_len(&null) != 0 ||
        CBS_len(&alg_id) != 0) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
      return 0;
    }
  }

  // Parse the encryption scheme parameters. Note OpenSSL does not match the
  // specification. Per RFC 2898, this should depend on the encryption scheme.
  // In particular, RC2-CBC uses a SEQUENCE with version and IV. We align with
  // OpenSSL.
  CBS iv;
  if (!CBS_get_asn1(&enc_scheme, &iv, CBS_ASN1_OCTETSTRING) ||
      CBS_len(&enc_scheme) != 0) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_PRF);
    return 0;
  }

  return pkcs5_pbe2_cipher_init(ctx, cipher, md, (uint32_t)iterations, pass,
                                pass_len, CBS_data(&salt), CBS_len(&salt),
                                CBS_data(&iv), CBS_len(&iv), 0 /* decrypt */);
}